

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O0

void ge_scalarmult_base(ge_p3 *h,uchar *a)

{
  timeval *in_R8;
  int local_1f0;
  undefined1 local_1ec [4];
  int i;
  ge_precomp t;
  ge_p2 s;
  ge_p1p1 r;
  char carry;
  char e [64];
  uchar *a_local;
  ge_p3 *h_local;
  
  for (local_1f0 = 0; local_1f0 < 0x20; local_1f0 = local_1f0 + 1) {
    *(byte *)((long)r.T + (long)(local_1f0 << 1) + 0x24) = a[local_1f0] & 0xf;
    *(char *)((long)r.T + (long)(local_1f0 * 2 + 1) + 0x24) = (char)((int)(uint)a[local_1f0] >> 4);
  }
  r.T[8]._3_1_ = '\0';
  for (local_1f0 = 0; local_1f0 < 0x3f; local_1f0 = local_1f0 + 1) {
    *(char *)((long)r.T + (long)local_1f0 + 0x24) =
         *(char *)((long)r.T + (long)local_1f0 + 0x24) + r.T[8]._3_1_;
    r.T[8]._3_1_ = (char)(*(char *)((long)r.T + (long)local_1f0 + 0x24) + '\b') >> 4;
    *(char *)((long)r.T + (long)local_1f0 + 0x24) =
         *(char *)((long)r.T + (long)local_1f0 + 0x24) + r.T[8]._3_1_ * -0x10;
  }
  ge_p3_0(h);
  for (local_1f0 = 1; local_1f0 < 0x40; local_1f0 = local_1f0 + 2) {
    select((int)local_1ec,(fd_set *)((long)local_1f0 / 2 & 0xffffffff),
           (fd_set *)(ulong)(uint)(int)*(char *)((long)r.T + (long)local_1f0 + 0x24),(fd_set *)0x2,
           in_R8);
    ge_madd((ge_p1p1 *)(s.Z + 8),h,(ge_precomp *)local_1ec);
    ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z + 8));
  }
  ge_p3_dbl((ge_p1p1 *)(s.Z + 8),h);
  ge_p1p1_to_p2((ge_p2 *)(t.xy2d + 8),(ge_p1p1 *)(s.Z + 8));
  ge_p2_dbl((ge_p1p1 *)(s.Z + 8),(ge_p2 *)(t.xy2d + 8));
  ge_p1p1_to_p2((ge_p2 *)(t.xy2d + 8),(ge_p1p1 *)(s.Z + 8));
  ge_p2_dbl((ge_p1p1 *)(s.Z + 8),(ge_p2 *)(t.xy2d + 8));
  ge_p1p1_to_p2((ge_p2 *)(t.xy2d + 8),(ge_p1p1 *)(s.Z + 8));
  ge_p2_dbl((ge_p1p1 *)(s.Z + 8),(ge_p2 *)(t.xy2d + 8));
  ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z + 8));
  for (local_1f0 = 0; local_1f0 < 0x40; local_1f0 = local_1f0 + 2) {
    select((int)local_1ec,(fd_set *)((long)local_1f0 / 2 & 0xffffffff),
           (fd_set *)(ulong)(uint)(int)*(char *)((long)r.T + (long)local_1f0 + 0x24),(fd_set *)0x2,
           in_R8);
    ge_madd((ge_p1p1 *)(s.Z + 8),h,(ge_precomp *)local_1ec);
    ge_p1p1_to_p3(h,(ge_p1p1 *)(s.Z + 8));
  }
  return;
}

Assistant:

void ge_scalarmult_base(ge_p3 *h, const unsigned char *a) {
    signed char e[64];
    signed char carry;
    ge_p1p1 r;
    ge_p2 s;
    ge_precomp t;
    int i;

    for (i = 0; i < 32; ++i) {
        e[2 * i + 0] = (a[i] >> 0) & 15;
        e[2 * i + 1] = (a[i] >> 4) & 15;
    }

    /* each e[i] is between 0 and 15 */
    /* e[63] is between 0 and 7 */
    carry = 0;

    for (i = 0; i < 63; ++i) {
        e[i] += carry;
        carry = e[i] + 8;
        carry >>= 4;
        e[i] -= carry << 4;
    }

    e[63] += carry;
    /* each e[i] is between -8 and 8 */
    ge_p3_0(h);

    for (i = 1; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }

    ge_p3_dbl(&r, h);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p3(h, &r);

    for (i = 0; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }
}